

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasLazyFields(Descriptor *descriptor,Options *options)

{
  long lVar1;
  once_flag *poVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  bVar4 = 0 < *(int *)(descriptor + 0x68);
  if (0 < *(int *)(descriptor + 0x68)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(descriptor + 0x28);
      if ((*(char *)(*(long *)(lVar1 + 0x78 + lVar6) + 0x4d) == '\x01') &&
         (*(int *)(lVar1 + 0x3c + lVar6) != 3)) {
        poVar2 = *(once_flag **)(lVar1 + 0x30 + lVar6);
        if (poVar2 != (once_flag *)0x0) {
          local_40 = (FieldDescriptor *)(lVar1 + lVar6);
          local_38 = FieldDescriptor::TypeOnceInit;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (poVar2,&local_38,&local_40);
        }
        if (*(int *)(lVar1 + 0x38 + lVar6) == 0xb) {
          if (options->enforce_mode == kSpeed) {
            if (options->opensource_runtime != true) goto LAB_0022fcab;
          }
          else if (((options->enforce_mode != kLiteRuntime) &&
                   (*(int *)(*(long *)(*(long *)(lVar1 + 0x28 + lVar6) + 0x88) + 0xa4) != 3)) &&
                  ((options->opensource_runtime & 1U) == 0)) {
LAB_0022fcab:
            if (bVar4) {
              return true;
            }
            break;
          }
        }
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x98;
      bVar4 = lVar5 < *(int *)(descriptor + 0x68);
    } while (lVar5 < *(int *)(descriptor + 0x68));
  }
  bVar4 = 0 < *(int *)(descriptor + 0x7c);
  if (0 < *(int *)(descriptor + 0x7c)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(descriptor + 0x50);
      if ((*(char *)(*(long *)(lVar1 + 0x78 + lVar6) + 0x4d) == '\x01') &&
         (*(int *)(lVar1 + 0x3c + lVar6) != 3)) {
        poVar2 = *(once_flag **)(lVar1 + 0x30 + lVar6);
        if (poVar2 != (once_flag *)0x0) {
          local_40 = (FieldDescriptor *)(lVar1 + lVar6);
          local_38 = FieldDescriptor::TypeOnceInit;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (poVar2,&local_38,&local_40);
        }
        if (*(int *)(lVar1 + 0x38 + lVar6) == 0xb) {
          if (options->enforce_mode == kSpeed) {
            if (options->opensource_runtime != true) goto LAB_0022fcba;
          }
          else if (((options->enforce_mode != kLiteRuntime) &&
                   (*(int *)(*(long *)(*(long *)(lVar1 + 0x28 + lVar6) + 0x88) + 0xa4) != 3)) &&
                  ((options->opensource_runtime & 1U) == 0)) {
LAB_0022fcba:
            if (bVar4) {
              return true;
            }
            break;
          }
        }
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x98;
      bVar4 = lVar5 < *(int *)(descriptor + 0x7c);
    } while (lVar5 < *(int *)(descriptor + 0x7c));
  }
  bVar4 = 0 < *(int *)(descriptor + 0x70);
  if ((0 < *(int *)(descriptor + 0x70)) &&
     (bVar3 = HasLazyFields(*(Descriptor **)(descriptor + 0x38),options), !bVar3)) {
    lVar6 = 0;
    lVar5 = 0x90;
    do {
      lVar6 = lVar6 + 1;
      bVar4 = lVar6 < *(int *)(descriptor + 0x70);
      if (*(int *)(descriptor + 0x70) <= lVar6) {
        return bVar4;
      }
      bVar3 = HasLazyFields((Descriptor *)(lVar5 + *(long *)(descriptor + 0x38)),options);
      lVar5 = lVar5 + 0x90;
    } while (!bVar3);
  }
  return bVar4;
}

Assistant:

static bool HasLazyFields(const Descriptor* descriptor,
                          const Options& options) {
  for (int field_idx = 0; field_idx < descriptor->field_count(); field_idx++) {
    if (IsLazy(descriptor->field(field_idx), options)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->extension_count(); idx++) {
    if (IsLazy(descriptor->extension(idx), options)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->nested_type_count(); idx++) {
    if (HasLazyFields(descriptor->nested_type(idx), options)) {
      return true;
    }
  }
  return false;
}